

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::listen_succeeded_alert::~listen_succeeded_alert(listen_succeeded_alert *this)

{
  operator_delete(this,0x38);
  return;
}

Assistant:

struct TORRENT_EXPORT listen_succeeded_alert final : alert
	{
#if TORRENT_ABI_VERSION == 1
		enum socket_type_t : std::uint8_t
		{
			tcp TORRENT_DEPRECATED_ENUM,
			tcp_ssl TORRENT_DEPRECATED_ENUM,
			udp TORRENT_DEPRECATED_ENUM,
			i2p TORRENT_DEPRECATED_ENUM,
			socks5 TORRENT_DEPRECATED_ENUM,
			utp_ssl TORRENT_DEPRECATED_ENUM
		};
#endif

		// internal
		TORRENT_UNEXPORT listen_succeeded_alert(aux::stack_allocator& alloc
			, lt::address const& listen_addr
			, int listen_port
			, lt::socket_type_t t);
		TORRENT_UNEXPORT listen_succeeded_alert(aux::stack_allocator& alloc
			, tcp::endpoint const& ep
			, lt::socket_type_t t);
		TORRENT_UNEXPORT listen_succeeded_alert(aux::stack_allocator& alloc
			, udp::endpoint const& ep
			, lt::socket_type_t t);

		TORRENT_DEFINE_ALERT_PRIO(listen_succeeded_alert, 49, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// the address libtorrent ended up listening on. This address
		// refers to the local interface.
		aux::noexcept_movable<lt::address> address;

		// the port libtorrent ended up listening on.
		int const port;

		// the type of listen socket this alert refers to.
		lt::socket_type_t const socket_type;

#if TORRENT_ABI_VERSION == 1
		// the endpoint libtorrent ended up listening on. The address
		// refers to the local interface and the port is the listen port.
		TORRENT_DEPRECATED aux::noexcept_movable<tcp::endpoint> endpoint;

		// the type of listen socket this alert refers to.
		TORRENT_DEPRECATED socket_type_t sock_type;
#endif
	}